

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  model_name mVar1;
  element_type *peVar2;
  int32_t iVar3;
  int64_t iVar4;
  Dictionary *this_00;
  long lVar5;
  float lr;
  real rVar6;
  vector<int,_std::allocator<int>_> line;
  vector<int,_std::allocator<int>_> labels;
  __shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> local_3c0;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_3a0;
  Model model;
  ifstream ifs;
  
  std::ifstream::ifstream
            (&ifs,(string *)
                  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,_S_in);
  iVar4 = utils::size(&ifs);
  utils::seek(&ifs,(iVar4 * threadId) /
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         thread);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3a0,
             &(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3b0,
             &(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3c0,(__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this);
  Model::Model(&model,(shared_ptr<fasttext::Matrix> *)&local_3a0,
               (shared_ptr<fasttext::Matrix> *)&local_3b0,(shared_ptr<fasttext::Args> *)&local_3c0,
               threadId);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a0._M_refcount);
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&line,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(&model,(vector<long,_std::allocator<long>_> *)&line);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&line,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(&model,(vector<long,_std::allocator<long>_> *)&line);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&line);
  iVar4 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  do {
    lVar5 = 0;
    do {
      do {
        if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            epoch * iVar4 <= (this->tokenCount_).super___atomic_base<long>._M_i) {
          if (threadId == 0) {
            rVar6 = Model::getLoss(&model);
            LOCK();
            (this->loss_)._M_i = rVar6;
            UNLOCK();
          }
          std::ifstream::close();
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&labels.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&line.super__Vector_base<int,_std::allocator<int>_>);
          Model::~Model(&model);
          std::ifstream::~ifstream(&ifs);
          return;
        }
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        lr = (float)((1.0 - (double)((float)(this->tokenCount_).super___atomic_base<long>._M_i /
                                    (float)(peVar2->epoch * iVar4))) * peVar2->lr);
        mVar1 = peVar2->model;
        if (mVar1 == cbow) {
          iVar3 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)&ifs,&line,&model.rng);
          cbow(this,&model,lr,&line);
LAB_001208ad:
          lVar5 = lVar5 + iVar3;
        }
        else {
          if (mVar1 == sg) {
            iVar3 = Dictionary::getLine((this->dict_).
                                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,(istream *)&ifs,&line,&model.rng);
            skipgram(this,&model,lr,&line);
            goto LAB_001208ad;
          }
          if (mVar1 == sup) {
            this_00 = (this->dict_).
                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar3 = Dictionary::getLine(this_00,(istream *)&ifs,&line,&labels);
            supervised((FastText *)this_00,&model,lr,&line,&labels);
            goto LAB_001208ad;
          }
        }
      } while (lVar5 <= ((this->args_).
                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        lrUpdateRate);
      LOCK();
      (this->tokenCount_).super___atomic_base<long>._M_i =
           (this->tokenCount_).super___atomic_base<long>._M_i + lVar5;
      UNLOCK();
      lVar5 = 0;
    } while ((threadId != 0) ||
            (lVar5 = 0,
            ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose < 2));
    rVar6 = Model::getLoss(&model);
    LOCK();
    (this->loss_)._M_i = rVar6;
    UNLOCK();
  } while( true );
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model model(input_, output_, args_, threadId);
  if (args_->model == model_name::sup) {
    model.setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model.setTargetCounts(dict_->getCounts(entry_type::word));
  }

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount_ < args_->epoch * ntokens) {
    real progress = real(tokenCount_) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    if (args_->model == model_name::sup) {
      localTokenCount += dict_->getLine(ifs, line, labels);
      supervised(model, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      localTokenCount += dict_->getLine(ifs, line, model.rng);
      cbow(model, lr, line);
    } else if (args_->model == model_name::sg) {
      localTokenCount += dict_->getLine(ifs, line, model.rng);
      skipgram(model, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount_ += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1)
        loss_ = model.getLoss();
    }
  }
  if (threadId == 0)
    loss_ = model.getLoss();
  ifs.close();
}